

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Object * __thiscall
Am_Object::Set_Type_Check(Am_Object *this,Am_Slot_Key key,unsigned_short type)

{
  Am_Slot_Data *pAVar1;
  
  if (this->data == (Am_Object_Data *)0x0) {
    Am_Error("Set_Type_Check called on a (0L) object.");
  }
  pAVar1 = Am_Object_Data::find_slot(this->data,key);
  if ((pAVar1 != (Am_Slot_Data *)0x0) && (pAVar1->context == this->data)) {
    pAVar1->type_check = type;
    return this;
  }
  slot_error("Set_Type_Check: slot does not exist or is not local",this,key);
}

Assistant:

Am_Object &
Am_Object::Set_Type_Check(Am_Slot_Key key, unsigned short type)
{
  if (!data)
    Am_Error("Set_Type_Check called on a (0L) object.");
  Am_Slot_Data *slot = data->find_slot(key);
  if (!slot || slot->context != data)
    slot_error("Set_Type_Check: slot does not exist or is not local", *this,
               key);
  Am_Slot(slot).Set_Type_Check(type);
  return *this;
}